

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O2

UBool __thiscall
icu_63::FieldPositionIterator::operator==(FieldPositionIterator *this,FieldPositionIterator *rhs)

{
  UVector32 *other;
  UBool UVar1;
  
  if (rhs == this) {
    return '\x01';
  }
  if (this->pos == rhs->pos) {
    other = rhs->data;
    if (this->data == (UVector32 *)0x0) {
      return other == (UVector32 *)0x0;
    }
    if (other != (UVector32 *)0x0) {
      UVar1 = UVector32::operator==(this->data,other);
      return UVar1;
    }
  }
  return '\0';
}

Assistant:

UBool FieldPositionIterator::operator==(const FieldPositionIterator &rhs) const {
  if (&rhs == this) {
    return TRUE;
  }
  if (pos != rhs.pos) {
    return FALSE;
  }
  if (!data) {
    return rhs.data == NULL;
  }
  return rhs.data ? data->operator==(*rhs.data) : FALSE;
}